

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

linked_ptr<testing::ActionInterface<test_result_(bool)>_> * __thiscall
testing::internal::linked_ptr<testing::ActionInterface<test_result_(bool)>_>::operator=
          (linked_ptr<testing::ActionInterface<test_result_(bool)>_> *this,
          linked_ptr<testing::ActionInterface<test_result_(bool)>_> *ptr)

{
  linked_ptr_internal *this_00;
  ActionInterface<test_result_(bool)> *pAVar1;
  bool bVar2;
  
  if (ptr != this) {
    this_00 = &this->link_;
    bVar2 = linked_ptr_internal::depart(this_00);
    if ((bVar2) && (this->value_ != (ActionInterface<test_result_(bool)> *)0x0)) {
      (*this->value_->_vptr_ActionInterface[1])();
    }
    pAVar1 = ptr->value_;
    this->value_ = pAVar1;
    if (pAVar1 == (ActionInterface<test_result_(bool)> *)0x0) {
      this_00->next_ = this_00;
    }
    else {
      linked_ptr_internal::join(this_00,&ptr->link_);
    }
  }
  return this;
}

Assistant:

linked_ptr& operator=(linked_ptr const& ptr) {
    if (&ptr != this) {
      depart();
      copy(&ptr);
    }
    return *this;
  }